

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* args::Wrap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *in,size_type width,size_type firstlinewidth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  size_type sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  string item;
  istringstream stream;
  ostringstream line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  size_type local_330;
  string local_328;
  byte abStack_308 [88];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [8];
  pointer local_1a0;
  ios_base local_138 [264];
  
  uVar3 = std::__cxx11::string::find((char)in,10);
  if (uVar3 == 0xffffffffffffffff) {
    if (firstlinewidth == 0) {
      firstlinewidth = width;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&local_328,(string *)in,_S_in);
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    if ((abStack_308[*(long *)(local_328._M_dataplus._M_p + -0x18)] & 5) == 0) {
      paVar1 = &local_370.field_2;
      lVar7 = 0;
      local_330 = width;
      do {
        local_370._M_string_length = 0;
        local_370.field_2._M_local_buf[0] = '\0';
        local_370._M_dataplus._M_p = (pointer)paVar1;
        std::operator>>((istream *)&local_328,(string *)&local_370);
        if (local_370._M_string_length == 0) {
          if (lVar7 != 0 && firstlinewidth < lVar7 + 1U) {
            lVar5 = 0;
            goto LAB_00105d32;
          }
        }
        else {
          sVar4 = 0;
          lVar5 = 0;
          do {
            lVar5 = lVar5 + 1;
            sVar4 = sVar4 + 1;
          } while (local_370._M_string_length != sVar4);
          if (firstlinewidth < lVar7 + lVar5 + 1U && lVar7 != 0) {
LAB_00105d32:
            std::__cxx11::stringbuf::str();
            paVar2 = &local_350.field_2;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&local_350);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != paVar2) {
              operator_delete(local_350._M_dataplus._M_p);
            }
            local_350._M_string_length = 0;
            local_350.field_2._M_local_buf[0] = '\0';
            local_350._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::stringbuf::str((string *)&local_1a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != paVar2) {
              operator_delete(local_350._M_dataplus._M_p);
            }
            lVar6 = 0;
            lVar7 = 0;
            firstlinewidth = local_330;
            if (lVar5 == 0) goto LAB_00105dc5;
          }
          else {
            if (lVar5 == 0) goto LAB_00105dc5;
            if (lVar7 == 0) {
              lVar6 = 0;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
              lVar6 = lVar7 + 1;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_370._M_dataplus._M_p,local_370._M_string_length);
          lVar7 = lVar6 + lVar5;
        }
LAB_00105dc5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != paVar1) {
          operator_delete(local_370._M_dataplus._M_p);
        }
      } while ((abStack_308[*(long *)(local_328._M_dataplus._M_p + -0x18)] & 5) == 0);
      if (lVar7 != 0) {
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != paVar1) {
          operator_delete(local_370._M_dataplus._M_p);
        }
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_328);
    std::ios_base::~ios_base(local_2b0);
  }
  else {
    std::__cxx11::string::string((string *)&local_328,(string *)in,0,uVar3);
    Wrap(__return_storage_ptr__,&local_328,width,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    std::__cxx11::string::string
              ((string *)&local_328,(string *)in,uVar3 + 1,(allocator *)&local_370);
    Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1a8,&local_328,width,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,local_1a8,local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Wrap(const std::string &in, const std::string::size_type width, std::string::size_type firstlinewidth = 0)
    {
        // Preserve existing line breaks
        const auto newlineloc = in.find('\n');
        if (newlineloc != in.npos)
        {
            auto first = Wrap(std::string(in, 0, newlineloc), width);
            auto second = Wrap(std::string(in, newlineloc + 1), width);
            first.insert(
                std::end(first),
                std::make_move_iterator(std::begin(second)),
                std::make_move_iterator(std::end(second)));
            return first;
        }
        if (firstlinewidth == 0)
        {
            firstlinewidth = width;
        }
        auto currentwidth = firstlinewidth;

        std::istringstream stream(in);
        std::vector<std::string> output;
        std::ostringstream line;
        std::string::size_type linesize = 0;
        while (stream)
        {
            std::string item;
            stream >> item;
            auto itemsize = Glyphs(item);
            if ((linesize + 1 + itemsize) > currentwidth)
            {
                if (linesize > 0)
                {
                    output.push_back(line.str());
                    line.str(std::string());
                    linesize = 0;
                    currentwidth = width;
                }
            }
            if (itemsize > 0)
            {
                if (linesize)
                {
                    ++linesize;
                    line << " ";
                }
                line << item;
                linesize += itemsize;
            }
        }
        if (linesize > 0)
        {
            output.push_back(line.str());
        }
        return output;
    }